

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2r2rect.cc
# Opt level: O0

S2R2Rect * S2R2Rect::FromCellId(S2R2Rect *__return_storage_ptr__,S2CellId id)

{
  Vector2<double> local_40;
  R2Point local_30;
  double local_20;
  double size;
  S2CellId id_local;
  
  size = (double)id.id_;
  id_local.id_ = (uint64)__return_storage_ptr__;
  local_20 = S2CellId::GetSizeST((S2CellId *)&size);
  local_30 = S2CellId::GetCenterST((S2CellId *)&size);
  Vector2<double>::Vector2(&local_40,local_20,local_20);
  FromCenterSize(__return_storage_ptr__,&local_30,&local_40);
  return __return_storage_ptr__;
}

Assistant:

S2R2Rect S2R2Rect::FromCellId(S2CellId id) {
  double size = id.GetSizeST();
  return FromCenterSize(id.GetCenterST(), R2Point(size, size));
}